

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O0

string * arangodb::velocypack::Dumper::toString_abi_cxx11_(Slice slice,Options *options)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  StringSink sink;
  string *buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  Options *in_stack_ffffffffffffffc0;
  Sink *in_stack_ffffffffffffffc8;
  Slice in_stack_ffffffffffffffd0;
  
  this = in_RDI;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffd0._start);
  StringSinkImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  StringSinkImpl((StringSinkImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,in_RDI);
  dump(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  return in_RDI;
}

Assistant:

std::string Dumper::toString(Slice slice, Options const* options) {
  std::string buffer;
  StringSink sink(&buffer);
  dump(slice, &sink, options);
  return buffer;
}